

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int av1_search_intra_uv_modes_in_interframe
              (IntraModeSearchState *intra_search_state,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize
              ,RD_STATS *rd_stats,RD_STATS *rd_stats_y,RD_STATS *rd_stats_uv,int64_t best_rd)

{
  BLOCK_SIZE *pBVar1;
  int iVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar3;
  undefined4 *in_stack_00000008;
  long in_stack_00000010;
  int64_t uv_rd;
  int64_t uv_dist;
  int uv_rate;
  TX_SIZE uv_tx;
  int try_palette;
  PALETTE_MODE_INFO *pmi;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  uint8_t *in_stack_00000158;
  int64_t *in_stack_00000160;
  int *in_stack_00000168;
  int *in_stack_00000170;
  MACROBLOCK *in_stack_00000178;
  AV1_COMP *in_stack_00000180;
  BLOCK_SIZE in_stack_000001a0;
  TX_SIZE in_stack_000001a8;
  MACROBLOCKD *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  bool local_7a;
  
  pBVar1 = (BLOCK_SIZE *)**(undefined8 **)(in_RDX + 0x2058);
  bVar3 = false;
  if ((*(byte *)(in_RSI + 0x4244c) & 1) != 0) {
    iVar2 = av1_allow_palette((uint)(*(byte *)(in_RSI + 0x3c16f) & 1),*pBVar1);
    bVar3 = iVar2 != 0;
  }
  if (*(int *)(in_RDI + 0x1c) == 0x7fffffff) {
    av1_get_tx_size(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    av1_rd_pick_intra_sbuv_mode
              (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168,
               in_stack_00000160,in_stack_00000158,in_stack_000001a0,in_stack_000001a8);
    *(BLOCK_SIZE *)(in_RDI + 0x31) = pBVar1[3];
    if (bVar3) {
      memcpy((void *)(in_RDI + 0x32),pBVar1 + 0x5e,0x32);
    }
    *(BLOCK_SIZE *)(in_RDI + 100) = pBVar1[0x59];
    if (in_stack_00000010 <
        ((long)*(int *)(in_RDI + 0x20) * (long)*(int *)(in_RDX + 0x4218) + 0x100 >> 9) +
        *(long *)(in_RDI + 0x28) * 0x80) {
      *(undefined4 *)(in_RDI + 4) = 1;
      return 0;
    }
  }
  *in_stack_00000008 = *(undefined4 *)(in_RDI + 0x20);
  *(undefined8 *)(in_stack_00000008 + 2) = *(undefined8 *)(in_RDI + 0x28);
  *(undefined1 *)(in_stack_00000008 + 8) = *(undefined1 *)(in_RDI + 0x30);
  local_7a = false;
  if (*(char *)(in_R9 + 0x20) != '\0') {
    local_7a = *(char *)(in_stack_00000008 + 8) != '\0';
  }
  *(bool *)(in_R8 + 0x20) = local_7a;
  pBVar1[3] = *(BLOCK_SIZE *)(in_RDI + 0x31);
  if (bVar3) {
    pBVar1[0x8f] = *(BLOCK_SIZE *)(in_RDI + 99);
    *(undefined8 *)(pBVar1 + 0x6e) = *(undefined8 *)(in_RDI + 0x42);
    *(undefined8 *)(pBVar1 + 0x76) = *(undefined8 *)(in_RDI + 0x4a);
    *(undefined8 *)(pBVar1 + 0x7e) = *(undefined8 *)(in_RDI + 0x52);
    *(undefined8 *)(pBVar1 + 0x86) = *(undefined8 *)(in_RDI + 0x5a);
  }
  pBVar1[0x59] = *(BLOCK_SIZE *)(in_RDI + 100);
  return 1;
}

Assistant:

int av1_search_intra_uv_modes_in_interframe(
    IntraModeSearchState *intra_search_state, const AV1_COMP *cpi,
    MACROBLOCK *x, BLOCK_SIZE bsize, RD_STATS *rd_stats,
    const RD_STATS *rd_stats_y, RD_STATS *rd_stats_uv, int64_t best_rd) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->ref_frame[0] == INTRA_FRAME);

  // TODO(chiyotsai@google.com): Consolidate the chroma search code here with
  // the one in av1_search_palette_mode.
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cm->features.allow_screen_content_tools, mbmi->bsize);

  assert(intra_search_state->rate_uv_intra == INT_MAX);
  if (intra_search_state->rate_uv_intra == INT_MAX) {
    // If no good uv-predictor had been found, search for it.
    const TX_SIZE uv_tx = av1_get_tx_size(AOM_PLANE_U, xd);
    av1_rd_pick_intra_sbuv_mode(cpi, x, &intra_search_state->rate_uv_intra,
                                &intra_search_state->rate_uv_tokenonly,
                                &intra_search_state->dist_uvs,
                                &intra_search_state->skip_uvs, bsize, uv_tx);
    intra_search_state->mode_uv = mbmi->uv_mode;
    if (try_palette) intra_search_state->pmi_uv = *pmi;
    intra_search_state->uv_angle_delta = mbmi->angle_delta[PLANE_TYPE_UV];

    const int uv_rate = intra_search_state->rate_uv_tokenonly;
    const int64_t uv_dist = intra_search_state->dist_uvs;
    const int64_t uv_rd = RDCOST(x->rdmult, uv_rate, uv_dist);
    if (uv_rd > best_rd) {
      // If there is no good intra uv-mode available, we can skip all intra
      // modes.
      intra_search_state->skip_intra_modes = 1;
      return 0;
    }
  }

  // If we are here, then the encoder has found at least one good intra uv
  // predictor, so we can directly copy its statistics over.
  // TODO(any): the stats here is not right if the best uv mode is CFL but the
  // best y mode is palette.
  rd_stats_uv->rate = intra_search_state->rate_uv_tokenonly;
  rd_stats_uv->dist = intra_search_state->dist_uvs;
  rd_stats_uv->skip_txfm = intra_search_state->skip_uvs;
  rd_stats->skip_txfm = rd_stats_y->skip_txfm && rd_stats_uv->skip_txfm;
  mbmi->uv_mode = intra_search_state->mode_uv;
  if (try_palette) {
    pmi->palette_size[1] = intra_search_state->pmi_uv.palette_size[1];
    memcpy(pmi->palette_colors + PALETTE_MAX_SIZE,
           intra_search_state->pmi_uv.palette_colors + PALETTE_MAX_SIZE,
           2 * PALETTE_MAX_SIZE * sizeof(pmi->palette_colors[0]));
  }
  mbmi->angle_delta[PLANE_TYPE_UV] = intra_search_state->uv_angle_delta;

  return 1;
}